

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O0

doublecomplex * doublecomplexCalloc(size_t n)

{
  doublecomplex *pdVar1;
  char local_138 [8];
  char msg [256];
  double local_30;
  doublecomplex zero;
  size_t i;
  doublecomplex *buf;
  size_t n_local;
  
  memset(&local_30,0,0x10);
  pdVar1 = (doublecomplex *)superlu_malloc(n << 4);
  if (pdVar1 == (doublecomplex *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n",
            "SUPERLU_MALLOC failed for buf in doublecomplexCalloc()\n",0x2c2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zmemory.c");
    superlu_abort_and_exit(local_138);
  }
  for (zero.i = 0.0; (ulong)zero.i < n; zero.i = (double)((long)zero.i + 1)) {
    pdVar1[(long)zero.i].r = local_30;
    pdVar1[(long)zero.i].i = zero.r;
  }
  return pdVar1;
}

Assistant:

doublecomplex *doublecomplexCalloc(size_t n)
{
    doublecomplex *buf;
    register size_t i;
    doublecomplex zero = {0.0, 0.0};
    buf = (doublecomplex *) SUPERLU_MALLOC(n * (size_t) sizeof(doublecomplex));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC failed for buf in doublecomplexCalloc()\n");
    }
    for (i = 0; i < n; ++i) buf[i] = zero;
    return (buf);
}